

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O0

void __thiscall SHMException::SHMException(SHMException *this,string *message)

{
  string *message_local;
  SHMException *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__SHMException_00107cb0;
  std::__cxx11::string::string((string *)&this->message,(string *)message);
  return;
}

Assistant:

SHMException::SHMException( const std::string &message ) : std::exception(),
                                                           message( message )
{
}